

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O0

void Diligent::anon_unknown_61::ValidateComputePipelineCreateInfo
               (ComputePipelineStateCreateInfo *CreateInfo,IRenderDevice *pDevice)

{
  int iVar1;
  Char *Message;
  long lVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char (*in_RCX) [19];
  char *local_a0;
  char *local_98;
  Char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  ComputePipelineStateCreateInfo *local_60;
  PipelineStateDesc *PSODesc;
  DeviceFeatures *Features;
  undefined1 local_40 [8];
  string msg;
  IRenderDevice *pDevice_local;
  ComputePipelineStateCreateInfo *CreateInfo_local;
  
  msg.field_2._8_8_ = pDevice;
  if (pDevice == (IRenderDevice *)0x0) {
    FormatString<char[26],char[19]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",(char (*) [26])0xcc143e,
               in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"ValidateComputePipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x2a5);
    std::__cxx11::string::~string((string *)local_40);
  }
  lVar2 = (**(code **)(*(long *)msg.field_2._8_8_ + 0xc0))();
  PSODesc = (PipelineStateDesc *)(lVar2 + 0xc);
  local_60 = CreateInfo;
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_COMPUTE) {
    local_68 = GetPipelineTypeString
                         ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
    if ((local_60->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name ==
        (Char *)0x0) {
      local_98 = "";
    }
    else {
      local_98 = (local_60->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
    }
    local_70 = local_98;
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[31]>
              (false,"ValidateComputePipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x2aa,(char (*) [16])"Description of ",&local_68,(char (*) [7])0xc0e54c,&local_70,
               (char (*) [15])"\' is invalid: ",(char (*) [31])"Pipeline type must be COMPUTE.");
  }
  ValidatePipelineResourceSignatures
            (&CreateInfo->super_PipelineStateCreateInfo,(IRenderDevice *)msg.field_2._8_8_);
  ValidatePipelineResourceLayoutDesc((PipelineStateDesc *)local_60,(DeviceFeatures *)PSODesc);
  if (CreateInfo->pCS == (IShader *)0x0) {
    local_78 = GetPipelineTypeString((local_60->super_PipelineStateCreateInfo).PSODesc.PipelineType)
    ;
    if ((local_60->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name ==
        (Char *)0x0) {
      local_a0 = "";
    }
    else {
      local_a0 = (local_60->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
    }
    local_80 = local_a0;
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[33]>
              (false,"ValidateComputePipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x2b0,(char (*) [16])"Description of ",&local_78,(char (*) [7])0xc0e54c,&local_80,
               (char (*) [15])"\' is invalid: ",(char (*) [33])"Compute shader must not be null.");
  }
  if (CreateInfo->pCS != (IShader *)0x0) {
    iVar1 = (*(CreateInfo->pCS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    if (*(int *)(CONCAT44(extraout_var,iVar1) + 8) != 0x20) {
      iVar1 = (*(CreateInfo->pCS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      local_88 = GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_00,iVar1) + 8));
      LogError<true,char_const*,char[26],char[8],char[8]>
                (false,"ValidateComputePipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x2b2,&local_88,(char (*) [26])" is not a valid type for ",(char (*) [8])0xd029d1,
                 (char (*) [8])0xcc12ef);
    }
  }
  return;
}

Assistant:

void ValidateComputePipelineCreateInfo(const ComputePipelineStateCreateInfo& CreateInfo,
                                       const IRenderDevice*                  pDevice) noexcept(false)
{
    VERIFY_EXPR(pDevice != nullptr);
    const DeviceFeatures& Features = pDevice->GetDeviceInfo().Features;

    const PipelineStateDesc& PSODesc = CreateInfo.PSODesc;
    if (PSODesc.PipelineType != PIPELINE_TYPE_COMPUTE)
        LOG_PSO_ERROR_AND_THROW("Pipeline type must be COMPUTE.");

    ValidatePipelineResourceSignatures(CreateInfo, pDevice);
    ValidatePipelineResourceLayoutDesc(PSODesc, Features);

    if (CreateInfo.pCS == nullptr)
        LOG_PSO_ERROR_AND_THROW("Compute shader must not be null.");

    VALIDATE_SHADER_TYPE(CreateInfo.pCS, SHADER_TYPE_COMPUTE, "compute")
}